

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_dht(session_impl *this)

{
  bool bVar1;
  ulong uVar2;
  session_impl *this_local;
  
  bVar1 = session_settings::get_bool(&this->m_settings,0x803e);
  if (bVar1) {
    session_settings::get_str_abi_cxx11_(&this->m_settings,0xb);
    uVar2 = ::std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (bVar1 = ::std::
                vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                ::empty(&this->m_dht_router_nodes), bVar1)) {
      update_dht_bootstrap_nodes(this);
    }
    else {
      start_dht(this);
    }
  }
  else {
    stop_dht(this);
  }
  return;
}

Assistant:

void session_impl::update_dht()
	{
#ifndef TORRENT_DISABLE_DHT
		if (m_settings.get_bool(settings_pack::enable_dht))
		{
			if (!m_settings.get_str(settings_pack::dht_bootstrap_nodes).empty()
				&& m_dht_router_nodes.empty())
			{
				// if we have bootstrap nodes configured, make sure we initiate host
				// name lookups. once these complete, the DHT will be started.
				// they are tracked by m_outstanding_router_lookups
				update_dht_bootstrap_nodes();
			}
			else
			{
				start_dht();
			}
		}
		else
			stop_dht();
#endif
	}